

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_Session * UA_SessionManager_getSession(UA_SessionManager *sm,UA_NodeId *token)

{
  UA_Boolean UVar1;
  UA_DateTime UVar2;
  uint local_68;
  uint local_60;
  uint local_5c;
  session_list_entry *local_50;
  session_list_entry *current;
  UA_NodeId *token_local;
  UA_SessionManager *sm_local;
  
  local_50 = (sm->sessions).lh_first;
  while( true ) {
    if (local_50 == (session_list_entry *)0x0) {
      UA_LOG_INFO((sm->server->config).logger,UA_LOGCATEGORY_SESSION,
                  "Try to use Session with token %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x but is not found"
                  ,(ulong)(token->identifier).numeric,(ulong)(token->identifier).guid.data2,
                  (ulong)(token->identifier).guid.data3,(uint)(token->identifier).guid.data4[0],
                  (uint)(token->identifier).guid.data4[1],(uint)(token->identifier).guid.data4[2],
                  (uint)(token->identifier).guid.data4[3],(uint)(token->identifier).guid.data4[4],
                  (uint)(token->identifier).guid.data4[5],(uint)(token->identifier).guid.data4[6],
                  (uint)(token->identifier).guid.data4[7]);
      return (UA_Session *)0x0;
    }
    UVar1 = UA_NodeId_equal(&(local_50->session).authenticationToken,token);
    if (UVar1) break;
    local_50 = (local_50->pointers).le_next;
  }
  UVar2 = UA_DateTime_nowMonotonic();
  if ((local_50->session).validTill < UVar2) {
    if ((local_50->session).channel == (UA_SecureChannel *)0x0) {
      local_60 = 0;
    }
    else {
      if (((local_50->session).channel)->connection == (UA_Connection *)0x0) {
        local_5c = 0;
      }
      else {
        local_5c = ((local_50->session).channel)->connection->sockfd;
      }
      local_60 = local_5c;
    }
    if ((local_50->session).channel == (UA_SecureChannel *)0x0) {
      local_68 = 0;
    }
    else {
      local_68 = (((local_50->session).channel)->securityToken).channelId;
    }
    UA_LOG_INFO((sm->server->config).logger,UA_LOGCATEGORY_SESSION,
                "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Client tries to use a session that has timed out"
                ,(ulong)local_60,(ulong)local_68,
                (ulong)(local_50->session).sessionId.identifier.numeric,
                (uint)(local_50->session).sessionId.identifier.guid.data2,
                (uint)(local_50->session).sessionId.identifier.guid.data3,
                (uint)(local_50->session).sessionId.identifier.guid.data4[0],
                (uint)(local_50->session).sessionId.identifier.guid.data4[1],
                (uint)(local_50->session).sessionId.identifier.guid.data4[2],
                (uint)(local_50->session).sessionId.identifier.guid.data4[3],
                (uint)(local_50->session).sessionId.identifier.guid.data4[4],
                (uint)(local_50->session).sessionId.identifier.guid.data4[5],
                (uint)(local_50->session).sessionId.identifier.guid.data4[6],
                (uint)(local_50->session).sessionId.identifier.guid.data4[7]);
    return (UA_Session *)0x0;
  }
  return &local_50->session;
}

Assistant:

UA_Session *
UA_SessionManager_getSession(UA_SessionManager *sm, const UA_NodeId *token) {
    session_list_entry *current = NULL;
    LIST_FOREACH(current, &sm->sessions, pointers) {
        /* Token does not match */
        if(!UA_NodeId_equal(&current->session.authenticationToken, token))
            continue;

        /* Session has timed out */
        if(UA_DateTime_nowMonotonic() > current->session.validTill) {
            UA_LOG_INFO_SESSION(sm->server->config.logger, &current->session,
                                "Client tries to use a session that has timed out");
            return NULL;
        }

        /* Ok, return */
        return &current->session;
    }

    /* Session not found */
    UA_LOG_INFO(sm->server->config.logger, UA_LOGCATEGORY_SESSION,
                "Try to use Session with token " UA_PRINTF_GUID_FORMAT " but is not found",
                UA_PRINTF_GUID_DATA(token->identifier.guid));
    return NULL;
}